

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
BuildWithDepsLogTestRestatMissingDepfileDepslog::Run
          (BuildWithDepsLogTestRestatMissingDepfileDepslog *this)

{
  VirtualFileSystem *this_00;
  int *piVar1;
  bool bVar2;
  string err;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  string local_58;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  local_38 = local_28;
  local_30 = 0;
  local_28[0] = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"header.in",&local_79);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_7a);
  this_00 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_;
  VirtualFileSystem::Create(this_00,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"out.d",&local_79);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"out: header.h",&local_7a);
  VirtualFileSystem::Create(this_00,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"header.h",&local_79);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_7a);
  VirtualFileSystem::Create(this_00,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"out",(allocator<char> *)&local_58);
  BuildTest::RebuildTarget
            ((BuildTest *)this,&local_78,
             "rule true\n  command = true\n  restat = 1\nbuild header.h: true header.in\nbuild out: cat header.h\n  deps = gcc\n  depfile = out.d\n"
             ,"build_log","ninja_deps",(State *)0x0);
  std::__cxx11::string::~string((string *)&local_78);
  bVar2 = testing::Test::Check
                    (g_current_test,
                     (long)*(pointer *)
                            ((long)&(this->super_BuildWithDepsLogTest).super_BuildTest.
                                    command_runner_.commands_ran_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data + 8) -
                     (long)(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                           commands_ran_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start == 0x40,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                     ,0x9e2,"2u == command_runner_.commands_ran_.size()");
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"out",(allocator<char> *)&local_58);
    BuildTest::RebuildTarget
              ((BuildTest *)this,&local_78,
               "rule true\n  command = true\n  restat = 1\nbuild header.h: true header.in\nbuild out: cat header.h\n  deps = gcc\n  depfile = out.d\n"
               ,"build_log","ninja_deps",(State *)0x0);
    std::__cxx11::string::~string((string *)&local_78);
    bVar2 = testing::Test::Check
                      (g_current_test,
                       *(pointer *)
                        ((long)&(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                                commands_ran_.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data + 8) ==
                       (this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                       commands_ran_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x9e6,"0u == command_runner_.commands_ran_.size()");
    if (bVar2) {
      piVar1 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.now_;
      *piVar1 = *piVar1 + 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"header.in",&local_79);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_7a);
      VirtualFileSystem::Create(this_00,&local_78,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"out",(allocator<char> *)&local_58);
      BuildTest::RebuildTarget
                ((BuildTest *)this,&local_78,
                 "rule true\n  command = true\n  restat = 1\nbuild header.h: true header.in\nbuild out: cat header.h\n  deps = gcc\n  depfile = out.d\n"
                 ,"build_log","ninja_deps2",(State *)0x0);
      std::__cxx11::string::~string((string *)&local_78);
      bVar2 = testing::Test::Check
                        (g_current_test,
                         (long)*(pointer *)
                                ((long)&(this->super_BuildWithDepsLogTest).super_BuildTest.
                                        command_runner_.commands_ran_.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data + 8) -
                         (long)(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                               commands_ran_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start == 0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x9f0,"2u == command_runner_.commands_ran_.size()");
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"out",(allocator<char> *)&local_58);
        BuildTest::RebuildTarget
                  ((BuildTest *)this,&local_78,
                   "rule true\n  command = true\n  restat = 1\nbuild header.h: true header.in\nbuild out: cat header.h\n  deps = gcc\n  depfile = out.d\n"
                   ,"build_log","ninja_deps2",(State *)0x0);
        std::__cxx11::string::~string((string *)&local_78);
        bVar2 = testing::Test::Check
                          (g_current_test,
                           *(pointer *)
                            ((long)&(this->super_BuildWithDepsLogTest).super_BuildTest.
                                    command_runner_.commands_ran_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data + 8) ==
                           (this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                           commands_ran_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x9f4,"0u == command_runner_.commands_ran_.size()");
        if (bVar2) {
          piVar1 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.now_;
          *piVar1 = *piVar1 + 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,"header.in",&local_79);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_7a);
          VirtualFileSystem::Create(this_00,&local_78,&local_58);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"out",&local_79);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_7a);
          VirtualFileSystem::Create(this_00,&local_78,&local_58);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,"out",(allocator<char> *)&local_58);
          BuildTest::RebuildTarget
                    ((BuildTest *)this,&local_78,
                     "rule true\n  command = true\n  restat = 1\nbuild header.h: true header.in\nbuild out: cat header.h\n  deps = gcc\n  depfile = out.d\n"
                     ,"build_log","ninja_deps2",(State *)0x0);
          std::__cxx11::string::~string((string *)&local_78);
          bVar2 = testing::Test::Check
                            (g_current_test,
                             (long)*(pointer *)
                                    ((long)&(this->super_BuildWithDepsLogTest).super_BuildTest.
                                            command_runner_.commands_ran_.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data + 8) -
                             (long)(this->super_BuildWithDepsLogTest).super_BuildTest.
                                   command_runner_.commands_ran_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start == 0x40,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                             ,0x9fc,"2u == command_runner_.commands_ran_.size()");
          if (bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_78,"out",(allocator<char> *)&local_58);
            BuildTest::RebuildTarget
                      ((BuildTest *)this,&local_78,
                       "rule true\n  command = true\n  restat = 1\nbuild header.h: true header.in\nbuild out: cat header.h\n  deps = gcc\n  depfile = out.d\n"
                       ,"build_log","ninja_deps2",(State *)0x0);
            std::__cxx11::string::~string((string *)&local_78);
            bVar2 = testing::Test::Check
                              (g_current_test,
                               *(pointer *)
                                ((long)&(this->super_BuildWithDepsLogTest).super_BuildTest.
                                        command_runner_.commands_ran_.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data + 8) ==
                               (this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                               commands_ran_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                               ,0xa00,"0u == command_runner_.commands_ran_.size()");
            if (bVar2) goto LAB_0012e55f;
          }
        }
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_0012e55f:
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

TEST_F(BuildWithDepsLogTest, RestatMissingDepfileDepslog) {
  string err;
  const char* manifest =
"rule true\n"
"  command = true\n"  // Would be "write if out-of-date" in reality.
"  restat = 1\n"
"build header.h: true header.in\n"
"build out: cat header.h\n"
"  deps = gcc\n"
"  depfile = out.d\n";

  // Build once to populate ninja deps logs from out.d
  fs_.Create("header.in", "");
  fs_.Create("out.d", "out: header.h");
  fs_.Create("header.h", "");

  RebuildTarget("out", manifest, "build_log", "ninja_deps");
  ASSERT_EQ(2u, command_runner_.commands_ran_.size());

  // Sanity: this rebuild should be NOOP
  RebuildTarget("out", manifest, "build_log", "ninja_deps");
  ASSERT_EQ(0u, command_runner_.commands_ran_.size());

  // Touch 'header.in', blank dependencies log (create a different one).
  // Building header.h triggers 'restat' outputs cleanup.
  // Validate that out is rebuilt netherless, as deps are missing.
  fs_.Tick();
  fs_.Create("header.in", "");

  // (switch to a new blank deps_log "ninja_deps2")
  RebuildTarget("out", manifest, "build_log", "ninja_deps2");
  ASSERT_EQ(2u, command_runner_.commands_ran_.size());

  // Sanity: this build should be NOOP
  RebuildTarget("out", manifest, "build_log", "ninja_deps2");
  ASSERT_EQ(0u, command_runner_.commands_ran_.size());

  // Check that invalidating deps by target timestamp also works here
  // Repeat the test but touch target instead of blanking the log.
  fs_.Tick();
  fs_.Create("header.in", "");
  fs_.Create("out", "");
  RebuildTarget("out", manifest, "build_log", "ninja_deps2");
  ASSERT_EQ(2u, command_runner_.commands_ran_.size());

  // And this build should be NOOP again
  RebuildTarget("out", manifest, "build_log", "ninja_deps2");
  ASSERT_EQ(0u, command_runner_.commands_ran_.size());
}